

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::SourceCodeInfo_Location::_InternalParse
          (SourceCodeInfo_Location *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  string *s;
  uint64 uVar5;
  char cVar6;
  uint32 uVar7;
  Arena *pAVar8;
  RepeatedField<int> *object;
  ArenaStringPtr *pAVar9;
  pair<const_char_*,_unsigned_int> pVar10;
  pair<const_char_*,_bool> pVar11;
  byte *local_60;
  ArenaStringPtr *local_58;
  ArenaStringPtr *local_50;
  InternalMetadataWithArena *local_48;
  RepeatedField<int> *local_40;
  RepeatedField<int> *local_38;
  
  local_48 = &this->_internal_metadata_;
  local_50 = &this->trailing_comments_;
  local_58 = &this->leading_comments_;
  local_38 = &this->span_;
  local_40 = &this->path_;
  local_60 = (byte *)ptr;
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= local_60) {
      if ((long)local_60 - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        return (char *)local_60;
      }
      pVar11 = internal::EpsCopyInputStream::DoneFallback
                         (&ctx->super_EpsCopyInputStream,(char *)local_60,ctx->group_depth_);
      local_60 = (byte *)pVar11.first;
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return (char *)local_60;
      }
    }
    bVar1 = *local_60;
    pVar10.second._0_1_ = bVar1;
    pVar10.first = (char *)(local_60 + 1);
    pVar10._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = local_60[1];
      uVar7 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar10 = internal::ReadTagFallback((char *)local_60,uVar7);
      }
      else {
        pVar10.second = uVar7;
        pVar10.first = (char *)(local_60 + 2);
        pVar10._12_4_ = 0;
      }
    }
    local_60 = (byte *)pVar10.first;
    if (local_60 == (byte *)0x0) {
LAB_00302d9d:
      cVar6 = '\x04';
      goto LAB_00302e6e;
    }
    uVar7 = pVar10.second;
    cVar6 = (char)pVar10.second;
    switch((uint)(pVar10._8_8_ >> 3) & 0x1fffffff) {
    case 1:
      object = local_40;
      if (cVar6 == '\n') {
LAB_00302c2f:
        local_60 = (byte *)internal::PackedInt32Parser(object,(char *)local_60,ctx);
      }
      else {
        if (cVar6 != '\b') break;
        uVar5 = internal::ReadVarint((char **)&local_60);
        _internal_add_path(this,(int32)uVar5);
      }
joined_r0x00302e1e:
      cVar6 = '\x04';
      if (local_60 != (byte *)0x0) {
        cVar6 = '\x02';
      }
      goto LAB_00302e6e;
    case 2:
      object = local_38;
      if (cVar6 == '\x12') goto LAB_00302c2f;
      if (cVar6 == '\x10') {
        uVar5 = internal::ReadVarint((char **)&local_60);
        _internal_add_span(this,(int32)uVar5);
        goto joined_r0x00302e1e;
      }
      break;
    case 3:
      if (cVar6 != '\x1a') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      pAVar8 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
      }
      pAVar9 = local_58;
      if (local_58->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (local_58,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        pAVar9 = local_58;
      }
LAB_00302c95:
      local_60 = (byte *)internal::InlineGreedyStringParser(pAVar9->ptr_,(char *)local_60,ctx);
      goto LAB_00302e5a;
    case 4:
      if (cVar6 == '\"') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        pAVar8 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
        }
        pAVar9 = local_50;
        if (local_50->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (local_50,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          pAVar9 = local_50;
        }
        goto LAB_00302c95;
      }
      break;
    case 6:
      if (cVar6 != '2') break;
      local_60 = local_60 + -1;
      do {
        local_60 = local_60 + 1;
        pRVar4 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar4 == (Rep *)0x0) {
LAB_00302ce7:
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->leading_detached_comments_).super_RepeatedPtrFieldBase,
                     (this->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_00302cf5:
          pRVar4 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
          pRVar4->allocated_size = pRVar4->allocated_size + 1;
          pAVar8 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.arena_;
          if (pAVar8 == (Arena *)0x0) {
            s = (string *)operator_new(0x20);
          }
          else {
            if (pAVar8->hooks_cookie_ != (void *)0x0) {
              Arena::OnArenaAllocation(pAVar8,(type_info *)&std::__cxx11::string::typeinfo,0x20);
            }
            s = (string *)
                internal::ArenaImpl::AllocateAlignedAndAddCleanup
                          (&pAVar8->impl_,0x20,internal::arena_destruct_object<std::__cxx11::string>
                          );
          }
          (s->_M_dataplus)._M_p = (pointer)&s->field_2;
          s->_M_string_length = 0;
          (s->field_2)._M_local_buf[0] = '\0';
          pRVar4 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
          iVar3 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
          (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
          pRVar4->elements[iVar3] = s;
        }
        else {
          iVar3 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar4->allocated_size <= iVar3) {
            if (pRVar4->allocated_size ==
                (this->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_)
            goto LAB_00302ce7;
            goto LAB_00302cf5;
          }
          (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
          s = (string *)pRVar4->elements[iVar3];
        }
        local_60 = (byte *)internal::InlineGreedyStringParser(s,(char *)local_60,ctx);
        if (local_60 == (byte *)0x0) goto LAB_00302d9d;
        cVar6 = '\x02';
      } while ((local_60 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_60 == 0x32));
      goto LAB_00302e6e;
    }
    if (uVar7 == 0 || (uVar7 & 7) == 4) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar7 - 1;
      cVar6 = '\t';
    }
    else {
      local_60 = (byte *)internal::UnknownFieldParse(uVar7,local_48,(char *)local_60,ctx);
LAB_00302e5a:
      cVar6 = (local_60 == (byte *)0x0) * '\x02' + '\x02';
    }
LAB_00302e6e:
    if (cVar6 != '\x02') {
      if (cVar6 == '\x04') {
        local_60 = (byte *)0x0;
      }
      return (char *)local_60;
    }
  } while( true );
}

Assistant:

const char* SourceCodeInfo_Location::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated int32 path = 1 [packed = true];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_path(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8) {
          _internal_add_path(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated int32 span = 2 [packed = true];
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_span(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16) {
          _internal_add_span(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string leading_comments = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_leading_comments(), ptr, ctx, "google.protobuf.SourceCodeInfo.Location.leading_comments");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string trailing_comments = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_trailing_comments(), ptr, ctx, "google.protobuf.SourceCodeInfo.Location.trailing_comments");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated string leading_detached_comments = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_leading_detached_comments(), ptr, ctx, "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}